

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqliteErrorFromPosixError(int posixError,int sqliteIOErr)

{
  if ((uint)posixError < 0x26) {
    if ((0x2000012810U >> ((ulong)(uint)posixError & 0x3f) & 1) != 0) {
      return 5;
    }
    if ((ulong)(uint)posixError == 1) {
      return 3;
    }
  }
  if (posixError == 0x6e) {
    return 5;
  }
  return 0xf0a;
}

Assistant:

static int sqliteErrorFromPosixError(int posixError, int sqliteIOErr) {
  assert( (sqliteIOErr == SQLITE_IOERR_LOCK) || 
          (sqliteIOErr == SQLITE_IOERR_UNLOCK) || 
          (sqliteIOErr == SQLITE_IOERR_RDLOCK) ||
          (sqliteIOErr == SQLITE_IOERR_CHECKRESERVEDLOCK) );
  switch (posixError) {
  case EACCES: 
  case EAGAIN:
  case ETIMEDOUT:
  case EBUSY:
  case EINTR:
  case ENOLCK:  
    /* random NFS retry error, unless during file system support 
     * introspection, in which it actually means what it says */
    return SQLITE_BUSY;
    
  case EPERM: 
    return SQLITE_PERM;
    
  default: 
    return sqliteIOErr;
  }
}